

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_fEf.cpp
# Opt level: O3

vector<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_> *
DronePoseLib::ValtonenOrnhagArxiv2021::get_fEf
          (vector<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_>
           *__return_storage_ptr__,MatrixXd *p1,MatrixXd *p2,Matrix3d *R1,Matrix3d *R2)

{
  double *dst;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined8 uVar15;
  undefined1 *puVar16;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pCVar17;
  long lVar18;
  CommaInitializer<Eigen::Matrix<double,_27,_1,_0,_27,_1>_> *pCVar19;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar20;
  evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> eVar21;
  char *__function;
  long lVar22;
  ulong uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  Vector3d kinv;
  SrcEvaluatorType srcEvaluator;
  double scale;
  Matrix<double,_3,_1,_0,_3,_1> workspace;
  Matrix3d x1;
  Vector3d s;
  RelPose relpose;
  ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> qr;
  Matrix3d x2;
  Matrix3d R;
  Vector4cd w;
  Matrix3d Q;
  Matrix3d skew_t;
  Matrix<double,_5,_1,_0,_5,_1> coeffs;
  Matrix<double,_27,_1,_0,_27,_1> x;
  Scalar local_570;
  assign_op<double,_double> *local_568;
  double dStack_560;
  undefined1 *local_558;
  long local_550;
  assign_op<double,_double> *local_548;
  double dStack_540;
  diagonal_product_evaluator_base<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Product<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::DiagonalMatrix<double,_3,_3>,_1>,_2>
  local_530;
  Scalar local_4d8;
  double local_4d0;
  double local_4c8;
  double local_4c0;
  Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
  local_4b8;
  Matrix<double,_3,_1,_0,_3,_1> local_490;
  undefined1 local_478 [48];
  undefined1 local_448 [32];
  Matrix<double,__1,__1,_0,__1,__1> local_428;
  value_type local_408;
  ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_398;
  double adStack_2a0 [4];
  undefined1 local_280 [24];
  undefined1 local_268 [8];
  double adStack_260 [2];
  undefined1 local_250 [48];
  undefined1 local_220 [24];
  undefined1 local_208 [8];
  double dStack_200;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  Matrix<double,_3,_3,_0,_3,_3> local_1c8;
  undefined1 *local_180 [2];
  double *local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  Matrix<double,_5,_1,_0,_5,_1> local_138;
  undefined8 local_110;
  Matrix<double,_27,_1,_0,_27,_1> local_108;
  
  if ((p1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows != 2)
  {
    __assert_fail("p1.rows() == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/DronePoseLib/src/solvers/valtonenornhag_arxiv_2021/fEf/get_fEf.cpp"
                  ,0x2d,
                  "std::vector<RelPose> DronePoseLib::ValtonenOrnhagArxiv2021::get_fEf(const Eigen::MatrixXd &, const Eigen::MatrixXd &, const Eigen::Matrix3d &, const Eigen::Matrix3d &)"
                 );
  }
  if ((p2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows != 2)
  {
    __assert_fail("p2.rows() == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/DronePoseLib/src/solvers/valtonenornhag_arxiv_2021/fEf/get_fEf.cpp"
                  ,0x2e,
                  "std::vector<RelPose> DronePoseLib::ValtonenOrnhagArxiv2021::get_fEf(const Eigen::MatrixXd &, const Eigen::MatrixXd &, const Eigen::Matrix3d &, const Eigen::Matrix3d &)"
                 );
  }
  if ((p1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols != 3)
  {
    __assert_fail("p1.cols() == nbr_pts",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/DronePoseLib/src/solvers/valtonenornhag_arxiv_2021/fEf/get_fEf.cpp"
                  ,0x2f,
                  "std::vector<RelPose> DronePoseLib::ValtonenOrnhagArxiv2021::get_fEf(const Eigen::MatrixXd &, const Eigen::MatrixXd &, const Eigen::Matrix3d &, const Eigen::Matrix3d &)"
                 );
  }
  if ((p2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols != 3)
  {
    __assert_fail("p2.cols() == nbr_pts",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/DronePoseLib/src/solvers/valtonenornhag_arxiv_2021/fEf/get_fEf.cpp"
                  ,0x30,
                  "std::vector<RelPose> DronePoseLib::ValtonenOrnhagArxiv2021::get_fEf(const Eigen::MatrixXd &, const Eigen::MatrixXd &, const Eigen::Matrix3d &, const Eigen::Matrix3d &)"
                 );
  }
  local_548 = (assign_op<double,_double> *)normalize2dpts(p1);
  dVar8 = normalize2dpts(p2);
  uVar24 = SUB84(dVar8,0);
  uVar25 = (undefined4)((ulong)dVar8 >> 0x20);
  if (dVar8 <= (double)local_548) {
    uVar24 = SUB84(local_548,0);
    uVar25 = (undefined4)((ulong)local_548 >> 0x20);
  }
  local_4c0 = (double)CONCAT44(uVar25,uVar24);
  local_398.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
  [0] = (double)&local_428;
  local_398.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
  [1] = 0.0;
  local_398.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
  [2] = 4.94065645841247e-324;
  local_398.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
  [3] = 4.94065645841247e-324;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)CONCAT44(uVar25,uVar24);
  pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                      ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_398,
                       &local_4c0);
  local_108.super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>.m_storage.m_data.array[0]
       = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
            (pCVar17,(Scalar *)&local_108);
  if (((long)local_398.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
             m_data.array[3] +
       (long)local_398.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
             m_data.array[1] == 3) &&
     ((Matrix<double,_3,_3,_0,_3,_3> *)
      local_398.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
      array[2] == (Matrix<double,_3,_3,_0,_3,_3> *)0x1)) {
    local_548 = (assign_op<double,_double> *)
                local_428.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_data;
    dStack_540 = (double)local_428.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_rows;
    local_398.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
    array[0] = (double)p1;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Homogeneous<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run((Matrix<double,_3,_3,_0,_3,_3> *)local_478,(SrcXprType *)&local_398,
          (assign_op<double,_double> *)&local_108);
    dst = adStack_2a0 + 1;
    local_398.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
    array[0] = (double)p2;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Homogeneous<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run((Matrix<double,_3,_3,_0,_3,_3> *)dst,(SrcXprType *)&local_398,
          (assign_op<double,_double> *)&local_108);
    lVar18 = 0x10;
    do {
      dVar8 = *(double *)
               ((long)local_490.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array + lVar18 + 0x10) * dStack_540;
      auVar6._8_4_ = SUB84(dVar8,0);
      auVar6._0_8_ = *(double *)
                      ((long)local_490.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                             m_storage.m_data.array + lVar18 + 8) * (double)local_548;
      auVar6._12_4_ = (int)((ulong)dVar8 >> 0x20);
      *(undefined1 (*) [16])
       ((long)local_490.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array + lVar18 + 8) = auVar6;
      *(double *)(local_478 + lVar18) =
           *(double *)(local_478 + lVar18) *
           (double)local_428.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols;
      lVar18 = lVar18 + 0x18;
    } while (lVar18 != 0x58);
    lVar18 = 0x10;
    do {
      dVar8 = *(double *)((long)adStack_2a0 + lVar18) * dStack_540;
      auVar7._8_4_ = SUB84(dVar8,0);
      auVar7._0_8_ = *(double *)((long)(&local_398.m_colNormsDirect + 2) + lVar18 + 8) *
                     (double)local_548;
      auVar7._12_4_ = (int)((ulong)dVar8 >> 0x20);
      *(undefined1 (*) [16])((long)(&local_398.m_colNormsDirect + 2) + lVar18 + 8) = auVar7;
      *(double *)((long)adStack_2a0 + lVar18 + 8) =
           *(double *)((long)adStack_2a0 + lVar18 + 8) *
           (double)local_428.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols;
      lVar18 = lVar18 + 0x18;
    } while (lVar18 != 0x58);
    dVar9 = (R2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[0];
    dVar10 = (R2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[1];
    dVar11 = (R2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[3];
    dVar12 = (R2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[4];
    dVar13 = (R2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[6];
    dVar14 = (R2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7];
    dVar8 = (R2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[2];
    dVar1 = (R2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[5];
    dVar2 = (R2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[8];
    lVar18 = 2;
    do {
      dVar3 = *(double *)R1;
      dVar4 = *(double *)((long)R1 + 0x18);
      dVar5 = *(double *)((long)R1 + 0x30);
      adStack_260[lVar18] = dVar5 * dVar13 + dVar4 * dVar11 + dVar3 * dVar9;
      adStack_260[lVar18 + 1] = dVar5 * dVar14 + dVar4 * dVar12 + dVar3 * dVar10;
      *(double *)(local_250 + lVar18 * 8) = dVar5 * dVar2 + dVar1 * dVar4 + dVar3 * dVar8;
      lVar18 = lVar18 + 3;
      R1 = (Matrix3d *)((long)R1 + 8);
    } while (lVar18 != 0xb);
    dStack_560 = 0.0;
    local_558 = (undefined1 *)0x1;
    local_550 = 3;
    uVar23 = (ulong)&local_108 >> 3;
    if ((uVar23 & 1) == 0) {
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>.m_storage.m_data.
      array[0] = (double)local_478._0_8_;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>.m_storage.m_data.
      array[1] = (double)local_478._8_8_;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>.m_storage.m_data.
      array[2] = (double)local_478._16_8_;
    }
    else {
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>.m_storage.m_data.
      array[0] = (double)local_478._0_8_;
      uVar23 = (ulong)(((uint)uVar23 & 1) << 3);
      uVar15 = *(undefined8 *)(local_478 + uVar23 + 8);
      *(undefined8 *)
       ((long)local_108.super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>.m_storage.
              m_data.array + uVar23) = *(undefined8 *)(local_478 + uVar23);
      *(undefined8 *)
       ((long)local_108.super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>.m_storage.
              m_data.array + uVar23 + 8) = uVar15;
    }
    local_398.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
    array[0] = (double)(local_478 + 0x18);
    local_398.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
    array[3] = 0.0;
    local_398.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
    array[4] = 4.94065645841247e-324;
    local_398.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
    array[5] = 1.48219693752374e-323;
    local_568 = (assign_op<double,_double> *)&local_108;
    local_398.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
    array[2] = (double)local_478;
    pCVar19 = Eigen::CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>> *)&local_568,
                         (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                          *)&local_398);
    local_408.F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [0] = (double)local_448;
    local_408.F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [3] = 0.0;
    local_408.F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [4] = 9.88131291682493e-324;
    local_408.F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [5] = 1.48219693752374e-323;
    local_408.F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [2] = (double)local_478;
    pCVar19 = Eigen::CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>> *)pCVar19,
                         (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                          *)&local_408);
    local_530.m_matImpl.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_result.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
         = 0.0;
    local_530.m_matImpl.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_result.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
         = 0.0;
    local_530.m_matImpl.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_result.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3]
         = 1.48219693752374e-323;
    local_530.m_diagImpl.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.m_d.data =
         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>)
         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>)dst;
    local_530.m_matImpl.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_result.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
         = (double)dst;
    pCVar19 = Eigen::CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>> *)pCVar19,
                         (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                          *)&local_530);
    local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
         = (double)local_280;
    local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3]
         = 0.0;
    local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4]
         = 4.94065645841247e-324;
    local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5]
         = 1.48219693752374e-323;
    local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
         = (double)dst;
    pCVar19 = Eigen::CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>> *)pCVar19,
                         (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                          *)&local_1c8);
    local_180[0] = local_268;
    local_168 = 0;
    local_160 = 2;
    local_158 = 3;
    local_170 = dst;
    pCVar19 = Eigen::CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>> *)pCVar19,
                         (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                          *)local_180);
    local_1f0 = 0;
    uStack_1e8 = 0;
    local_1e0 = 3;
    local_208 = (undefined1  [8])local_250;
    local_1f8 = local_250;
    pCVar19 = Eigen::CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>> *)pCVar19,
                         (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                          *)local_208);
    local_4b8.m_lhs.m_lhs.m_diagonal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[0] = (double)(local_250 + 0x18);
    local_4b8.m_lhs.m_rhs = (RhsNested)0x0;
    local_4b8.m_rhs = (RhsNested)0x1;
    local_490.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = 1.48219693752374e-323;
    local_4b8.m_lhs.m_lhs.m_diagonal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[2] = (double)local_250;
    pCVar19 = Eigen::CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>> *)pCVar19,
                         (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                          *)&local_4b8);
    local_138.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[0]
         = (double)local_220;
    local_138.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[3]
         = 0.0;
    local_138.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[4]
         = 9.88131291682493e-324;
    local_110 = 3;
    local_138.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[2]
         = (double)local_250;
    Eigen::CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>>::operator_
              ((CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>> *)pCVar19,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
               &local_138);
    if ((local_550 + (long)dStack_560 == 0x1b) && (local_558 == (undefined1 *)0x1)) {
      calculate_coefficients(&local_138,&local_108);
      solve_quartic((Vector4cd *)local_208,
                    local_138.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage
                    .m_data.array[1] /
                    local_138.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage
                    .m_data.array[0],
                    local_138.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage
                    .m_data.array[2] /
                    local_138.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage
                    .m_data.array[0],
                    local_138.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage
                    .m_data.array[3] /
                    local_138.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage
                    .m_data.array[0],
                    local_138.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage
                    .m_data.array[4] /
                    local_138.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage
                    .m_data.array[0]);
      (__return_storage_ptr__->
      super__Vector_base<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar18 = 0;
      do {
        if (ABS((&dStack_200)[lVar18 * 2]) < 1e-12) {
          create_M((Matrix3d *)&local_398,*(double *)(local_208 + lVar18 * 0x10),&local_108);
          local_398.m_isInitialized = false;
          local_398.m_usePrescribedThreshold = false;
          Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::computeInPlace
                    (&local_398);
          if (local_398.m_isInitialized == false) {
            __assert_fail("m_isInitialized && \"ColPivHouseholderQR is not initialized.\"",
                          "/usr/include/eigen3/Eigen/src/QR/ColPivHouseholderQR.h",0x291,
                          "typename ColPivHouseholderQR<MatrixType>::HouseholderSequenceType Eigen::ColPivHouseholderQR<Eigen::Matrix<double, 3, 3, 1, 3, 3>>::householderQ() const [MatrixType = Eigen::Matrix<double, 3, 3, 1, 3, 3>]"
                         );
          }
          local_530.m_diagImpl.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.m_d.data =
               (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>)&local_398
          ;
          local_530.m_matImpl.
          super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          .super_evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.m_d.data =
               (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>)
               &local_398.m_hCoeffs;
          local_530.m_matImpl.
          super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          .m_result.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0] = (double)((ulong)local_530.m_matImpl.
                                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                     .m_result.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                     m_storage.m_data.array[0] & 0xffffffffffffff00);
          local_530.m_matImpl.
          super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          .m_result.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[1] = 1.48219693752374e-323;
          local_530.m_matImpl.
          super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          .m_result.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[2] = 0.0;
          Eigen::
          HouseholderSequence<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,1,0,3,1>,1>::
          evalTo<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>>
                    ((HouseholderSequence<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,1,0,3,1>,1>
                      *)&local_530,&local_1c8,(Matrix<double,_3,_1,_0,_3,_1> *)&local_4b8);
          local_408.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] = local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[6];
          local_408.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1] = local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[7];
          local_408.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2] = local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[8];
          local_408.f = *(double *)(local_208 + lVar18 * 0x10) / local_4c0;
          local_568 = (assign_op<double,_double> *)(1.0 / local_408.f);
          local_530.m_diagImpl.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.m_d.data =
               (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>)&local_568
          ;
          local_530.m_matImpl.
          super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          .super_evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.m_d.data =
               (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>)
               (plainobjectbase_evaluator_data<double,_3>)0x0;
          local_530.m_matImpl.
          super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          .m_result.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0] = 4.94065645841247e-324;
          local_530.m_matImpl.
          super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          .m_result.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[1] = 4.94065645841247e-324;
          local_4b8.m_lhs.m_lhs.m_diagonal.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
               (double)local_568;
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                              ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_530
                               ,(Scalar *)&local_4b8);
          local_570 = 1.0;
          Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                    (pCVar17,&local_570);
          puVar16 = local_558;
          if (((long)local_530.m_matImpl.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_result.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[1] +
               (long)local_530.m_matImpl.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .super_evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                     .m_d.data != 3) ||
             ((double *)
              local_530.m_matImpl.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_result.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[0] != (double *)0x1)) goto LAB_00118e7a;
          local_548 = local_568;
          dStack_540 = dStack_560;
          local_530.m_matImpl.
          super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          .super_evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.m_d.data =
               (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>)
               (plainobjectbase_evaluator_data<double,_3>)0x0;
          local_530.m_matImpl.
          super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          .m_result.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0] = 4.94065645841247e-324;
          local_530.m_matImpl.
          super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          .m_result.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[1] = 4.94065645841247e-324;
          local_180[0] = (undefined1 *)0x0;
          local_4b8.m_lhs.m_lhs.m_diagonal.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
               (double)((ulong)local_408.t.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                               m_storage.m_data.array[2] ^ 0x8000000000000000);
          local_530.m_diagImpl.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.m_d.data =
               (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>)
               (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>)local_180;
          pCVar20 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                              ((CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_530
                               ,(Scalar *)&local_4b8);
          pCVar20 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                              (pCVar20,(double *)
                                       ((long)local_408.t.
                                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                              .m_storage.m_data.array + 8));
          pCVar20 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                              (pCVar20,(double *)
                                       ((long)local_408.t.
                                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                              .m_storage.m_data.array + 0x10));
          local_570 = 0.0;
          pCVar20 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                              (pCVar20,&local_570);
          local_4c8 = -local_408.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[0];
          pCVar20 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                              (pCVar20,&local_4c8);
          local_4d0 = -local_408.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[1];
          pCVar20 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                              (pCVar20,&local_4d0);
          pCVar20 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                              (pCVar20,(Scalar *)&local_408.t);
          local_4d8 = 0.0;
          Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                    (pCVar20,&local_4d8);
          if (((long)local_530.m_matImpl.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_result.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[1] +
               (long)local_530.m_matImpl.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .super_evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                     .m_d.data != 3) ||
             ((double *)
              local_530.m_matImpl.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_result.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[0] != (double *)0x3)) {
            __function = 
            "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::finished() [MatrixType = Eigen::Matrix<double, 3, 3>]"
            ;
            goto LAB_00118e8f;
          }
          local_4b8.m_lhs.m_lhs.m_diagonal.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
               (double)local_548;
          local_4b8.m_lhs.m_lhs.m_diagonal.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
               dStack_540;
          local_4b8.m_lhs.m_lhs.m_diagonal.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
               (double)puVar16;
          local_490.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] = (double)local_548;
          local_490.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1] = dStack_540;
          local_490.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2] = (double)puVar16;
          local_4b8.m_lhs.m_rhs = (RhsNested)local_180;
          local_4b8.m_rhs = (RhsNested)local_250;
          Eigen::internal::
          diagonal_product_evaluator_base<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Product<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::DiagonalMatrix<double,_3,_3>,_1>,_2>
          ::diagonal_product_evaluator_base(&local_530,&local_4b8,&local_490);
          lVar22 = 2;
          eVar21.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.m_d
          .data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>)
                  (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>)
                  local_530.m_diagImpl;
          do {
            dVar1 = ((double *)
                    ((long)local_530.m_matImpl.
                           super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                           .super_evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                           .m_d.data + (lVar22 + -2) * 8))[1];
            dVar8 = *(double *)
                     eVar21.
                     super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     .m_d.data;
            (&local_428.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols)[lVar22] =
                 (Index)(dVar8 * *(double *)
                                  ((long)local_530.m_matImpl.
                                         super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                         .super_evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                         super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                                         .m_d.data + (lVar22 + -2) * 8));
            local_408.F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
            m_data.array[lVar22 + 0xffffffffffffffff] = dVar8 * dVar1;
            local_408.F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
            m_data.array[lVar22] =
                 *(double *)
                  ((long)local_530.m_matImpl.
                         super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                         .super_evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                         .m_d.data + lVar22 * 8) *
                 *(double *)
                  eVar21.
                  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.
                  m_d.data;
            lVar22 = lVar22 + 3;
            eVar21.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.
            m_d.data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>)
                       ((long)eVar21.
                              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              .m_d.data + 8);
          } while (lVar22 != 0xb);
          std::vector<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_>::push_back
                    (__return_storage_ptr__,&local_408);
        }
        lVar18 = lVar18 + 1;
        if (lVar18 == 4) {
          return __return_storage_ptr__;
        }
      } while( true );
    }
    __function = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 27, 1>>::finished() [MatrixType = Eigen::Matrix<double, 27, 1>]"
    ;
  }
  else {
LAB_00118e7a:
    __function = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 1>>::finished() [MatrixType = Eigen::Matrix<double, 3, 1>]"
    ;
  }
LAB_00118e8f:
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,__function);
}

Assistant:

std::vector<RelPose> get_fEf(
        const Eigen::MatrixXd &p1,
        const Eigen::MatrixXd &p2,
        const Eigen::Matrix3d &R1,
        const Eigen::Matrix3d &R2
    ) {
        // This is a 3-point method
        int nbr_pts = 3;

        // We expect inhomogenous input data, i.e. p1 and p2 are 2x3 matrices
        assert(p1.rows() == 2);
        assert(p2.rows() == 2);
        assert(p1.cols() == nbr_pts);
        assert(p2.cols() == nbr_pts);

        // Compute normalization matrix
        double scale1 = normalize2dpts(p1);
        double scale2 = normalize2dpts(p2);
        double scale = std::max(scale1, scale2);
        Eigen::Vector3d s;
        s << scale, scale, 1.0;
        Eigen::DiagonalMatrix<double, 3> S = s.asDiagonal();

        // Normalize data
        Eigen::Matrix3d x1;
        Eigen::Matrix3d x2;
        x1 = p1.colwise().homogeneous();
        x2 = p2.colwise().homogeneous();
        x1 = S * x1;
        x2 = S * x2;

        // Compute relative rotation
        Eigen::Matrix3d R = R2 * R1.transpose();

        Eigen::Matrix<double, 27, 1> x;
        x << x1.col(0), x1.col(1), x1.col(2),
             x2.col(0), x2.col(1), x2.col(2),
             R.col(0), R.col(1), R.col(2);

        Eigen::Matrix<double, 5, 1> coeffs = calculate_coefficients(x);

        Eigen::Vector4cd w  = solve_quartic(
            coeffs(1) / coeffs(0),
            coeffs(2) / coeffs(0),
            coeffs(3) / coeffs(0),
            coeffs(4) / coeffs(0));

        // Construct putative output
        double thresh = 1e-12;
        Eigen::Matrix3d M;
        std::vector<RelPose> output;
        RelPose relpose;
        Eigen::Matrix3d Q;
        Eigen::Vector3d kinv;
        Eigen::DiagonalMatrix<double, 3> Kinv;
        Eigen::Matrix3d skew_t;

        // Householder is just 500 ns slower than analytic, but is significantly more stable
        for (int i=0; i < w.size(); i++) {
            if (std::abs(std::imag(w[i])) < thresh) {
                M = create_M(std::real(w[i]), x);
                auto qr = M.transpose().colPivHouseholderQr();
                Q = qr.householderQ();
                relpose.t = Q.col(2);
                relpose.f = std::real(w[i]) / scale;

                // Compute fundamental matrix
                kinv << 1.0 / relpose.f, 1.0 / relpose.f, 1.0;
                Kinv = kinv.asDiagonal();
                skew_t << 0, -relpose.t(2), relpose.t(1),
                          relpose.t(2), 0, -relpose.t(0),
                         -relpose.t(1), relpose.t(0), 0;
                relpose.F = Kinv * skew_t * R * Kinv;

                output.push_back(relpose);
            }
        }

        return output;
    }